

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_swipe.cc
# Opt level: O0

bool __thiscall
sptk::PitchExtractionBySwipe::Get
          (PitchExtractionBySwipe *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  bool bVar1;
  size_type sVar2;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  vector vVar5;
  int target_length;
  vector tmp_f0;
  double in_stack_00000278;
  double in_stack_00000280;
  double in_stack_00000288;
  double in_stack_00000290;
  double in_stack_00000298;
  vector<double,_std::allocator<double>_> *in_stack_000002a0;
  pointer *__value;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_40;
  bool local_1;
  vector<double,_std::allocator<double>_> *this_00;
  
  if ((((ulong)((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_RDI._M_current)[6]._M_current & 1) == 0) ||
     (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffff80._M_current), bVar1)) {
    local_1 = false;
  }
  else {
    if (in_RDX != 0) {
      vVar5 = swipe::swipe(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                           in_stack_00000280,in_stack_00000278);
      this_00 = (vector<double,_std::allocator<double>_> *)vVar5.v;
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      auVar4._8_4_ = (int)(sVar2 >> 0x20);
      auVar4._0_8_ = sVar2;
      auVar4._12_4_ = 0x45300000;
      dVar3 = ceil(((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                   (double)*(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                      *)in_RDI._M_current)[1]._M_current);
      local_40 = vVar5.x;
      if ((int)dVar3 < vVar5.x) {
        local_40 = (int)dVar3;
      }
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88._M_current);
      __value = &(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_40;
      std::vector<double,_std::allocator<double>_>::begin(this_00);
      std::
      copy<double*,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff80._M_current,in_RDI._M_current,in_stack_ffffffffffffff88);
      std::vector<double,_std::allocator<double>_>::begin(this_00);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_RDI._M_current,(difference_type)__value);
      std::vector<double,_std::allocator<double>_>::end(this_00);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff80,in_RDI,(double *)__value);
      vVar5.v = (double *)__value;
      vVar5._0_8_ = this_00;
      swipe::freev(vVar5);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PitchExtractionBySwipe::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    swipe::vector tmp_f0(swipe::swipe(
        waveform, sampling_rate_, lower_f0_, upper_f0_, voicing_threshold_,
        static_cast<double>(frame_shift_) / sampling_rate_));
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_f0.x) {
      tmp_f0.x = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0.v, tmp_f0.v + tmp_f0.x, f0->begin());
    std::fill(f0->begin() + tmp_f0.x, f0->end(), tmp_f0.v[tmp_f0.x - 1]);
    swipe::freev(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}